

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<std::tuple<const_trust_token_method_st_*,_bool>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_> *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
  *in_RSI;
  ParamGenerator<std::tuple<const_trust_token_method_st_*,_bool>_> PVar1;
  
  __p = (ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_> *)
        operator_new(0x28);
  __p->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_006e3d10;
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
                 *)(__p + 1),in_RSI);
  *(ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_> **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::ParamGeneratorInterface<std::tuple<trust_token_method_st_const*,bool>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<const_trust_token_method_st_*,_bool>_>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }